

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O0

image_char new_image_char(uint xsize,uint ysize)

{
  image_char piVar1;
  uchar *puVar2;
  image_char image;
  uint ysize_local;
  uint xsize_local;
  
  if ((xsize == 0) || (ysize == 0)) {
    error("new_image_char: invalid image size.");
  }
  piVar1 = (image_char)malloc(0x10);
  if (piVar1 == (image_char)0x0) {
    error("not enough memory.");
  }
  puVar2 = (uchar *)calloc((ulong)(xsize * ysize),1);
  piVar1->data = puVar2;
  if (piVar1->data == (uchar *)0x0) {
    error("not enough memory.");
  }
  piVar1->xsize = xsize;
  piVar1->ysize = ysize;
  return piVar1;
}

Assistant:

image_char new_image_char(unsigned int xsize, unsigned int ysize)
{
    image_char image;

    /* check parameters */
    if ( xsize == 0 || ysize == 0 ) error("new_image_char: invalid image size.");

    /* get memory */
    image = (image_char) malloc( sizeof(struct image_char_s) );
    if ( image == NULL ) error("not enough memory.");
    image->data = (unsigned char *) calloc( (size_t) (xsize * ysize),
                                            sizeof(unsigned char) );
    if ( image->data == NULL ) error("not enough memory.");

    /* set image size */
    image->xsize = xsize;
    image->ysize = ysize;

    return image;
}